

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::calculate
          (FunctionalTest7_8 *this,GLuint function,vec4<float> *left,vec4<float> *right,
          vec4<float> *out)

{
  vec4<float> *out_local;
  vec4<float> *right_local;
  vec4<float> *left_local;
  GLuint function_local;
  FunctionalTest7_8 *this_local;
  
  if (function == 0) {
    out->m_x = left->m_x + right->m_x;
    out->m_y = left->m_y + right->m_y;
    out->m_z = left->m_z + right->m_z;
    out->m_w = left->m_w + right->m_w;
  }
  else {
    out->m_x = left->m_x * right->m_x;
    out->m_y = left->m_y * right->m_y;
    out->m_z = left->m_z * right->m_z;
    out->m_w = left->m_w * right->m_w;
  }
  return;
}

Assistant:

void FunctionalTest7_8::calculate(glw::GLuint function, const Utils::vec4<glw::GLfloat>& left,
								  const Utils::vec4<glw::GLfloat>& right, Utils::vec4<glw::GLfloat>& out) const
{
	if (0 == function)
	{
		out.m_x = left.m_x + right.m_x;
		out.m_y = left.m_y + right.m_y;
		out.m_z = left.m_z + right.m_z;
		out.m_w = left.m_w + right.m_w;
	}
	else
	{
		out.m_x = left.m_x * right.m_x;
		out.m_y = left.m_y * right.m_y;
		out.m_z = left.m_z * right.m_z;
		out.m_w = left.m_w * right.m_w;
	}
}